

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryPool.cpp
# Opt level: O3

void __thiscall cali::MemoryPool::MemoryPoolImpl::~MemoryPoolImpl(MemoryPoolImpl *this)

{
  pointer pCVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  Chunk *c;
  pointer pCVar2;
  
  pCVar2 = (this->m_chunks).
           super__Vector_base<cali::MemoryPool::MemoryPoolImpl::Chunk,_std::allocator<cali::MemoryPool::MemoryPoolImpl::Chunk>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pCVar1 = (this->m_chunks).
           super__Vector_base<cali::MemoryPool::MemoryPoolImpl::Chunk,_std::allocator<cali::MemoryPool::MemoryPoolImpl::Chunk>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pCVar2 != pCVar1) {
    do {
      if (pCVar2->ptr != (uchar *)0x0) {
        operator_delete__(pCVar2->ptr);
      }
      pCVar2 = pCVar2 + 1;
    } while (pCVar2 != pCVar1);
    pCVar2 = (this->m_chunks).
             super__Vector_base<cali::MemoryPool::MemoryPoolImpl::Chunk,_std::allocator<cali::MemoryPool::MemoryPoolImpl::Chunk>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->m_chunks).
        super__Vector_base<cali::MemoryPool::MemoryPoolImpl::Chunk,_std::allocator<cali::MemoryPool::MemoryPoolImpl::Chunk>_>
        ._M_impl.super__Vector_impl_data._M_finish != pCVar2) {
      (this->m_chunks).
      super__Vector_base<cali::MemoryPool::MemoryPoolImpl::Chunk,_std::allocator<cali::MemoryPool::MemoryPoolImpl::Chunk>_>
      ._M_impl.super__Vector_impl_data._M_finish = pCVar2;
    }
  }
  if (pCVar2 != (pointer)0x0) {
    operator_delete(pCVar2,(long)(this->m_chunks).
                                 super__Vector_base<cali::MemoryPool::MemoryPoolImpl::Chunk,_std::allocator<cali::MemoryPool::MemoryPoolImpl::Chunk>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pCVar2);
  }
  this_00 = (this->m_config).mP.super___shared_ptr<cali::ConfigSetImpl,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    return;
  }
  return;
}

Assistant:

~MemoryPoolImpl()
    {
        for (auto& c : m_chunks)
            delete[] c.ptr;

        m_chunks.clear();
    }